

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O0

err_t btokCVCVal(octet *cert,size_t cert_len,octet *certa,size_t certa_len,octet *date)

{
  bool_t bVar1;
  btok_cvc_t *cvc_00;
  void *in_R8;
  btok_cvc_t *cvca;
  btok_cvc_t *cvc;
  void *stack;
  octet *in_stack_00000020;
  err_t code;
  octet *in_stack_ffffffffffffffa8;
  btok_cvc_t *cvca_00;
  err_t local_34;
  err_t local_4;
  
  if ((in_R8 == (void *)0x0) || (bVar1 = memIsValid(in_R8,6), bVar1 != 0)) {
    cvc_00 = (btok_cvc_t *)blobCreate((size_t)in_stack_ffffffffffffffa8);
    if (cvc_00 == (btok_cvc_t *)0x0) {
      local_4 = 0x6e;
    }
    else {
      cvca_00 = cvc_00 + 1;
      local_4 = btokCVCUnwrap((btok_cvc_t *)certa,(octet *)certa_len,(size_t)date,in_stack_00000020,
                              (size_t)stack);
      if (local_4 == 0) {
        local_4 = btokCVCUnwrap((btok_cvc_t *)certa,(octet *)certa_len,(size_t)date,
                                in_stack_00000020,(size_t)stack);
        if (local_4 == 0) {
          local_34 = btokCVCCheck2(cvc_00,cvca_00);
          if (local_34 == 0) {
            if (in_R8 != (void *)0x0) {
              bVar1 = tmDateIsValid2((octet *)cvca_00);
              if (bVar1 == 0) {
                local_34 = 0x134;
              }
              else {
                bVar1 = tmDateLeq2((octet *)cvca_00,in_stack_ffffffffffffffa8);
                if ((bVar1 == 0) ||
                   (bVar1 = tmDateLeq2((octet *)cvca_00,in_stack_ffffffffffffffa8), bVar1 == 0)) {
                  local_34 = 0x136;
                }
              }
            }
            blobClose((blob_t)0x161c68);
            local_4 = local_34;
          }
          else {
            blobClose((blob_t)0x161bf1);
            local_4 = local_34;
          }
        }
        else {
          blobClose((blob_t)0x161bc0);
        }
      }
      else {
        blobClose((blob_t)0x161b75);
      }
    }
  }
  else {
    local_4 = 0x6d;
  }
  return local_4;
}

Assistant:

err_t btokCVCVal(const octet cert[], size_t cert_len, 
	const octet certa[], size_t certa_len, const octet* date)
{
	err_t code;
	void* stack;
	btok_cvc_t* cvc;
	btok_cvc_t* cvca;
	// входной контроль
	if (!memIsNullOrValid(date, 6))
		return ERR_BAD_INPUT;
	// выделить и разметить память
	stack = blobCreate(2 * sizeof(btok_cvc_t));
	if (!stack)
		return ERR_OUTOFMEMORY;
	cvc = (btok_cvc_t*)stack;
	cvca = cvc + 1;
	// разобрать сертификаты
	code = btokCVCUnwrap(cvca, certa, certa_len, 0, 0);
	ERR_CALL_HANDLE(code, blobClose(stack));
	code = btokCVCUnwrap(cvc, cert, cert_len, cvca->pubkey, cvca->pubkey_len);
	ERR_CALL_HANDLE(code, blobClose(stack));
	// проверить соответствие
	code = btokCVCCheck2(cvc, cvca);
	ERR_CALL_HANDLE(code, blobClose(stack));
	// проверить дату
	if (date)
	{
		if (!tmDateIsValid2(date))
			code = ERR_BAD_DATE;
		else if (!tmDateLeq2(cvc->from, date) || !tmDateLeq2(date, cvc->until))
			code = ERR_OUTOFRANGE;
	}
	// завершить
	blobClose(stack);
	return code;
}